

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d8.cpp
# Opt level: O0

uint32 rw::d3d8::makeFVFDeclaration(uint32 flags,int32 numTex)

{
  undefined4 local_14;
  uint32 fvf;
  int32 numTex_local;
  uint32 flags_local;
  
  local_14 = 2;
  if ((flags & 0x10) != 0) {
    local_14 = 0x12;
  }
  if ((flags & 8) != 0) {
    local_14 = local_14 | 0x40;
  }
  return numTex << 8 | local_14;
}

Assistant:

uint32
makeFVFDeclaration(uint32 flags, int32 numTex)
{
	uint32 fvf = 0x2;
	if(flags & Geometry::NORMALS)
		fvf |= 0x10;
	if(flags & Geometry::PRELIT)
		fvf |= 0x40;
	fvf |= numTex << 8;
	return fvf;
}